

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_sort.cpp
# Opt level: O2

void duckdb::SinkDataChunk
               (Vector *child_vector,SelectionVector *sel,idx_t offset_lists_indices,
               vector<duckdb::LogicalType,_true> *types,
               vector<duckdb::LogicalType,_true> *payload_types,Vector *payload_vector,
               LocalSortState *param_7,bool *data_to_sort,Vector *lists_indices)

{
  reference pvVar1;
  DataChunk key_chunk;
  DataChunk payload_chunk;
  Vector slice;
  
  duckdb::Vector::Vector(&slice,child_vector,sel,offset_lists_indices);
  duckdb::DataChunk::DataChunk(&key_chunk);
  duckdb::DataChunk::InitializeEmpty(&key_chunk);
  pvVar1 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)&key_chunk,0);
  duckdb::Vector::Reference(pvVar1);
  pvVar1 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)&key_chunk,1);
  duckdb::Vector::Reference(pvVar1);
  duckdb::DataChunk::DataChunk(&payload_chunk);
  duckdb::DataChunk::InitializeEmpty(&payload_chunk);
  pvVar1 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)&payload_chunk,0)
  ;
  duckdb::Vector::Reference(pvVar1);
  duckdb::DataChunk::Verify();
  duckdb::DataChunk::Verify();
  duckdb::DataChunk::Flatten();
  duckdb::LocalSortState::SinkChunk((DataChunk *)param_7,&key_chunk);
  *data_to_sort = true;
  duckdb::DataChunk::~DataChunk(&payload_chunk);
  duckdb::DataChunk::~DataChunk(&key_chunk);
  Vector::~Vector(&slice);
  return;
}

Assistant:

void SinkDataChunk(Vector *child_vector, SelectionVector &sel, idx_t offset_lists_indices, vector<LogicalType> &types,
                   vector<LogicalType> &payload_types, Vector &payload_vector, LocalSortState &local_sort_state,
                   bool &data_to_sort, Vector &lists_indices) {

	// slice the child vector
	Vector slice(*child_vector, sel, offset_lists_indices);

	// initialize and fill key_chunk
	DataChunk key_chunk;
	key_chunk.InitializeEmpty(types);
	key_chunk.data[0].Reference(lists_indices);
	key_chunk.data[1].Reference(slice);
	key_chunk.SetCardinality(offset_lists_indices);

	// initialize and fill key_chunk and payload_chunk
	DataChunk payload_chunk;
	payload_chunk.InitializeEmpty(payload_types);
	payload_chunk.data[0].Reference(payload_vector);
	payload_chunk.SetCardinality(offset_lists_indices);

	key_chunk.Verify();
	payload_chunk.Verify();

	// sink
	key_chunk.Flatten();
	local_sort_state.SinkChunk(key_chunk, payload_chunk);
	data_to_sort = true;
}